

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O3

bool __thiscall xmrig::CudaBackend::isEnabled(CudaBackend *this,Algorithm *algorithm)

{
  Config *this_00;
  CudaConfig *pCVar1;
  mapped_type *pmVar2;
  String local_20;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  pCVar1 = Config::cuda(this_00);
  String::String(&local_20,"cn/blur");
  pmVar2 = std::
           map<xmrig::String,_xmrig::CudaThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CudaThreads>_>_>
           ::at(&(pCVar1->m_threads).m_profiles,&local_20);
  if (local_20.m_data != (char *)0x0) {
    operator_delete__(local_20.m_data);
  }
  return (pmVar2->m_data).super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (pmVar2->m_data).super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>.
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool xmrig::CudaBackend::isEnabled(const Algorithm &algorithm) const
{
    return !d_ptr->controller->config()->cuda().threads().get().isEmpty();
}